

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_vdpu2.c
# Opt level: O1

MPP_RET vdpu2_mpg4d_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MPP_RET MVar2;
  RK_U32 i;
  ulong uVar3;
  DecCbHalDone param;
  HalTaskInfo *local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  lVar1 = *(long *)((long)hal + 0x48);
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x20),0x10,(void *)0x0);
  if (MVar2 != MPP_OK) {
    _mpp_log_l(2,"hal_m4vd_vdpu2","poll cmd failed %d\n","vdpu2_mpg4d_wait",(ulong)(uint)MVar2);
  }
  if (((byte)hal_mpg4d_debug & 2) != 0) {
    uVar3 = 0;
    do {
      _mpp_log_l(4,"hal_m4vd_vdpu2","reg[%03d]: %08x\n",(char *)0x0,uVar3 & 0xffffffff,
                 (ulong)*(uint *)(lVar1 + uVar3 * 4));
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x9f);
  }
  if (*(MppCbCtx **)((long)hal + 0x18) != (MppCbCtx *)0x0) {
    local_38 = (ulong)((*(byte *)(lVar1 + 0xdc) & 0x10) == 0);
    uStack_40 = *(undefined8 *)((long)hal + 0x48);
    local_48 = task;
    mpp_callback_f("vdpu2_mpg4d_wait",*(MppCbCtx **)((long)hal + 0x18),&local_48);
  }
  return MVar2;
}

Assistant:

MPP_RET vdpu2_mpg4d_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    hal_mpg4_ctx *ctx = (hal_mpg4_ctx *)hal;
    M4vdVdpu2Regs_t *regs = (M4vdVdpu2Regs_t *)ctx->regs;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (hal_mpg4d_debug & MPG4D_HAL_DBG_REG_GET) {
        RK_U32 reg_count = (sizeof(M4vdVdpu2Regs_t) / sizeof(RK_U32));
        RK_U32 i = 0;

        for (i = 0; i < reg_count; i++) {
            mpp_log("reg[%03d]: %08x\n", i, ((RK_U32 *)regs)[i]);
        }
    }

    if (ctx->dec_cb) {
        DecCbHalDone param = { 0 };

        if (!regs->reg55_Interrupt.sw_dec_rdy_int)
            param.hard_err = 1;

        param.task = (void *)&task->dec;
        param.regs = (RK_U32 *)ctx->regs;

        mpp_callback(ctx->dec_cb, &param);
    }

    (void)task;
    return ret;
}